

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O2

mfb_stub * mfb_stub::GetInstance(mfb_window *window)

{
  int iVar1;
  mfb_stub *pmVar2;
  pointer ppmVar3;
  mfb_stub *local_18;
  
  ppmVar3 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((GetInstance(mfb_window*)::s_instances == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetInstance(mfb_window*)::s_instances),
     ppmVar3 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
               _M_impl.super__Vector_impl_data._M_start, iVar1 != 0)) {
    GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::vector<mfb_stub_*,_std::allocator<mfb_stub_*>_>::~vector,
                 &GetInstance::s_instances,&__dso_handle);
    __cxa_guard_release(&GetInstance(mfb_window*)::s_instances);
    ppmVar3 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  do {
    if (ppmVar3 ==
        GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pmVar2 = (mfb_stub *)operator_new(0xe8);
      memset(pmVar2,0,0xe8);
      local_18 = pmVar2;
      std::vector<mfb_stub*,std::allocator<mfb_stub*>>::emplace_back<mfb_stub*>
                ((vector<mfb_stub*,std::allocator<mfb_stub*>> *)&GetInstance::s_instances,&local_18)
      ;
      GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
      super__Vector_impl_data._M_finish[-1]->m_window = window;
      return GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
    }
    pmVar2 = *ppmVar3;
    ppmVar3 = ppmVar3 + 1;
  } while (pmVar2->m_window != window);
  return pmVar2;
}

Assistant:

mfb_stub *
mfb_stub::GetInstance(struct mfb_window *window) {
    static std::vector<mfb_stub *>  s_instances;

    for(mfb_stub *instance : s_instances) {
        if(instance->m_window == window) {
            return instance;
        }
    }

    s_instances.push_back(new mfb_stub);
    s_instances.back()->m_window = window;

    return s_instances.back();
}